

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformation::GetModelName_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  SystemInformation *this_local;
  
  SystemInformationImplementation::GetModelName_abi_cxx11_
            (__return_storage_ptr__,this->Implementation);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemInformation::GetModelName()
{
  return this->Implementation->GetModelName();
}